

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaTransformer.cpp
# Opt level: O2

TermList __thiscall Kernel::FormulaTransformer::apply(FormulaTransformer *this,TermList ts)

{
  SpecialTermData *this_00;
  uint uVar1;
  VList *pVVar2;
  Formula *pFVar3;
  TermList TVar4;
  TermList TVar5;
  TermList TVar6;
  ulong uVar7;
  NotImplementedException *this_01;
  uint64_t *puVar8;
  long lVar9;
  uint i;
  ulong uVar10;
  DArray<Kernel::TermList> terms;
  
  if ((ts._content & 1) == 0) {
    if (*(uint *)(ts._content + 8) < 0xfffffff9) {
      if ((*(byte *)(ts._content + 0x28) & 8) == 0) {
        terms._array = (TermList *)0x0;
        terms._size = 0;
        terms._capacity = 0;
        for (puVar8 = (uint64_t *)
                      (ts._content + 0x28 + (ulong)(*(uint *)(ts._content + 0xc) & 0xfffffff) * 8);
            ((uint)*puVar8 & 3) != 2; puVar8 = puVar8 + -1) {
          TVar6 = apply(this,*puVar8);
          Lib::Stack<Kernel::TermList>::push((Stack<Kernel::TermList> *)&terms,TVar6);
        }
        ts._content = (uint64_t)Term::create(ts._content,(TermList *)terms._capacity);
        Lib::Stack<Kernel::TermList>::~Stack((Stack<Kernel::TermList> *)&terms);
      }
    }
    else {
      this_00 = (SpecialTermData *)(ts._content - 0x28);
      switch(*(uint *)(ts._content + 8)) {
      case 0xfffffff9:
        Lib::DArray<Kernel::TermList>::DArray
                  (&terms,(ulong)(*(uint *)(ts._content + 0xc) & 0xfffffff));
        lVar9 = 0;
        for (uVar10 = 0; uVar7 = (ulong)(*(uint *)(ts._content + 0xc) & 0xfffffff), uVar10 < uVar7;
            uVar10 = uVar10 + 1) {
          TVar6 = apply(this,*(uint64_t *)(ts._content + 0x28 + (uVar7 + lVar9) * 8));
          terms._array[uVar10]._content = TVar6._content;
          lVar9 = lVar9 + -1;
        }
        TVar6 = Term::SpecialTermData::getSort(this_00);
        ts._content = (uint64_t)
                      Term::createMatch(TVar6,*(uint64_t *)(ts._content - 0x20),
                                        *(uint *)(ts._content + 0xc) & 0xfffffff,terms._array);
        Lib::DArray<Kernel::TermList>::~DArray(&terms);
        break;
      case 0xfffffffa:
        this_01 = (NotImplementedException *)__cxa_allocate_exception(0x38);
        Lib::NotImplementedException::NotImplementedException
                  (this_01,
                   "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/FormulaTransformer.cpp"
                   ,0x7d);
        __cxa_throw(this_01,&Lib::NotImplementedException::typeinfo,Lib::Exception::~Exception);
      case 0xfffffffb:
        uVar1 = *(uint *)(ts._content - 0x28);
        pVVar2 = *(VList **)(ts._content - 0x20);
        TVar6 = apply(this,*(uint64_t *)(ts._content - 0x18));
        TVar4 = apply(this,*(uint64_t *)
                            (ts._content + 0x28 +
                            (ulong)(*(uint *)(ts._content + 0xc) & 0xfffffff) * 8));
        TVar5 = Term::SpecialTermData::getSort(this_00);
        ts._content = (uint64_t)Term::createTupleLet(uVar1,pVVar2,TVar6,TVar4,TVar5);
        break;
      case 0xfffffffc:
        TVar6 = apply(this,(this_00->field_0)._lambdaData.lambdaExp._content);
        ts._content = (uint64_t)Term::createTuple(TVar6._content);
        break;
      case 0xfffffffd:
        pFVar3 = apply(this,(this_00->field_0)._iteData.condition);
        ts._content = (uint64_t)Term::createFormula(pFVar3);
        break;
      case 0xfffffffe:
        uVar1 = *(uint *)(ts._content - 0x28);
        pVVar2 = *(VList **)(ts._content - 0x20);
        TVar6 = apply(this,*(uint64_t *)(ts._content - 0x18));
        TVar4 = apply(this,*(uint64_t *)
                            (ts._content + 0x28 +
                            (ulong)(*(uint *)(ts._content + 0xc) & 0xfffffff) * 8));
        TVar5 = Term::SpecialTermData::getSort(this_00);
        ts._content = (uint64_t)Term::createLet(uVar1,pVVar2,TVar6,TVar4,TVar5);
        break;
      case 0xffffffff:
        pFVar3 = apply(this,*(Formula **)(ts._content - 0x28));
        TVar6 = apply(this,*(uint64_t *)
                            (ts._content + 0x28 +
                            (ulong)(*(uint *)(ts._content + 0xc) & 0xfffffff) * 8));
        TVar4 = apply(this,*(uint64_t *)
                            (ts._content + 0x20 +
                            (ulong)(*(uint *)(ts._content + 0xc) & 0xfffffff) * 8));
        TVar5 = Term::SpecialTermData::getSort(this_00);
        ts._content = (uint64_t)Term::createITE(pFVar3,TVar6,TVar4,TVar5);
      }
    }
  }
  return (TermList)ts._content;
}

Assistant:

TermList FormulaTransformer::apply(TermList ts) {
  if (ts.isVar()) {
    return ts;
  }

  Term* term = ts.term();

  if (term->isSpecial()) {
    Term::SpecialTermData *sd = ts.term()->getSpecialData();
    switch (sd->specialFunctor()) {
      case SpecialFunctor::ITE:
        return TermList(Term::createITE(apply(sd->getCondition()),
                                        apply(*term->nthArgument(0)),
                                        apply(*term->nthArgument(1)),
                                        sd->getSort()));

      case SpecialFunctor::FORMULA:
        return TermList(Term::createFormula(apply(sd->getFormula())));

      case SpecialFunctor::LET:
        return TermList(Term::createLet(sd->getFunctor(),
                                        sd->getVariables(),
                                        apply(sd->getBinding()),
                                        apply(*term->nthArgument(0)),
                                        sd->getSort()));

      case SpecialFunctor::LET_TUPLE:
        return TermList(Term::createTupleLet(sd->getFunctor(),
                                             sd->getTupleSymbols(),
                                             apply(sd->getBinding()),
                                             apply(*term->nthArgument(0)),
                                             sd->getSort()));

      case SpecialFunctor::TUPLE:
        return TermList(Term::createTuple(apply(TermList(sd->getTupleTerm())).term()));

      case SpecialFunctor::LAMBDA:
        NOT_IMPLEMENTED;
      case SpecialFunctor::MATCH: {
        DArray<TermList> terms(term->arity());
        for (unsigned i = 0; i < term->arity(); i++) {
          terms[i] = apply(*term->nthArgument(i));
        }
        return TermList(Term::createMatch(sd->getSort(), sd->getMatchedSort(), term->arity(), terms.begin()));
      }

    }
    ASSERTION_VIOLATION_REP(ts.toString());
  }

  if (term->shared()) {
    return ts;
  }

  Stack<TermList> args;
  Term::Iterator terms(term);
  while (terms.hasNext()) {
    args.push(apply(terms.next()));
  }

  return TermList(Term::create(term, args.begin()));
}